

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd.cc
# Opt level: O0

void GD::predict<false,true>(gd *g,base_learner *param_2,example *ec)

{
  long in_RDX;
  long in_RDI;
  float fVar1;
  vw *all;
  example *in_stack_ffffffffffffffd8;
  vw *all_00;
  
  all_00 = *(vw **)(in_RDI + 0x60);
  fVar1 = inline_predict(all_00,in_stack_ffffffffffffffd8);
  *(float *)(in_RDX + 0x68a8) = fVar1;
  *(float *)(in_RDX + 0x68a8) = (float)all_00->sd->contraction * *(float *)(in_RDX + 0x68a8);
  fVar1 = finalize_prediction((shared_data *)in_stack_ffffffffffffffd8,0.0);
  *(float *)(in_RDX + 0x6850) = fVar1;
  print_audit_features((vw *)g,(example *)param_2);
  return;
}

Assistant:

void predict(gd& g, base_learner&, example& ec)
{
  vw& all = *g.all;
  if (l1)
    ec.partial_prediction = trunc_predict(all, ec, all.sd->gravity);
  else
    ec.partial_prediction = inline_predict(all, ec);

  ec.partial_prediction *= (float)all.sd->contraction;
  ec.pred.scalar = finalize_prediction(all.sd, ec.partial_prediction);
  if (audit)
    print_audit_features(all, ec);
}